

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O1

void deserializeDecorations(QDataStream *stream,int version,InOutVariable *v)

{
  pointer piVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  quint8 b;
  int f;
  char local_3d;
  QFlagsStorage<QShaderDescription::ImageFlag> local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QDataStream::operator>>(stream,&v->location);
  QDataStream::operator>>(stream,&v->binding);
  QDataStream::operator>>(stream,&v->descriptorSet);
  local_3c.i = 0xaaaaaaaa;
  QDataStream::operator>>(stream,(int *)&local_3c);
  v->imageFormat = local_3c.i;
  QDataStream::operator>>(stream,(int *)&local_3c);
  (v->imageFlags).super_QFlagsStorageHelper<QShaderDescription::ImageFlag,_4>.
  super_QFlagsStorage<QShaderDescription::ImageFlag>.i = local_3c.i;
  if (4 < version) {
    QDataStream::operator>>(stream,(int *)&local_3c);
    QList<int>::resize(&v->arrayDims,(long)(int)local_3c.i);
    if (0 < (int)local_3c.i) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        piVar1 = QList<int>::data(&v->arrayDims);
        QDataStream::operator>>(stream,(int *)((long)piVar1 + lVar2));
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 4;
      } while (lVar3 < (int)local_3c.i);
    }
  }
  if (6 < version) {
    local_3d = -0x56;
    QDataStream::operator>>(stream,&local_3d);
    v->perPatch = local_3d != '\0';
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void deserializeDecorations(QDataStream *stream, int version, QShaderDescription::InOutVariable *v)
{
    (*stream) >> v->location;
    (*stream) >> v->binding;
    (*stream) >> v->descriptorSet;
    int f;
    (*stream) >> f;
    v->imageFormat = QShaderDescription::ImageFormat(f);
    (*stream) >> f;
    v->imageFlags = QShaderDescription::ImageFlags(f);

    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_VAR_ARRAYDIMS) {
        (*stream) >> f;
        v->arrayDims.resize(f);
        for (int i = 0; i < f; ++i)
            (*stream) >> v->arrayDims[i];
    }

    if (version > QShaderPrivate::QSB_VERSION_WITHOUT_NATIVE_SHADER_INFO) {
        quint8 b;
        (*stream) >> b;
        v->perPatch = b;
    }
}